

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O1

fy_atom * fy_fill_atom(fy_parser *fyp,int advance,fy_atom *handle)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t advance_00;
  
  fy_fill_atom_start(fyp,handle);
  if (0 < advance) {
    do {
      iVar2 = fy_parse_peek_at_offset(fyp,0);
      if (iVar2 < 0) break;
      advance_00 = 1;
      if ((0x7f < iVar2) && (advance_00 = 2, 0x7ff < iVar2)) {
        advance_00 = (ulong)(0xffff < iVar2) + 3;
      }
      fy_advance_octets(fyp,advance_00);
      if ((iVar2 == 0xd) && (iVar3 = fy_parse_peek_at_offset(fyp,0), iVar3 == 10)) {
        fy_advance_octets(fyp,1);
LAB_0013f79c:
        fyp->column = 0;
        fyp->nontab_column = 0;
        fyp->line = fyp->line + 1;
      }
      else {
        if ((fyp != (fy_parser *)0x0) &&
           (((iVar2 == 10 || (iVar2 == 0xd)) ||
            (((fyp->current_input == (fy_input *)0x0 || ((fyp->current_input->field_0x74 & 1) == 0))
             && ((iVar2 - 0x2028U < 2 || (iVar2 == 0x85)))))))) goto LAB_0013f79c;
        iVar3 = fyp->column;
        iVar1 = fyp->tabsize;
        if (iVar2 == 9 && iVar1 != 0) {
          iVar3 = (iVar3 + iVar1) - iVar3 % iVar1;
        }
        else {
          iVar3 = iVar3 + 1;
        }
        fyp->column = iVar3;
        fyp->nontab_column = fyp->nontab_column + 1;
      }
      advance = advance + -1;
    } while (advance != 0);
  }
  fy_fill_atom_end_at(fyp,handle,(fy_mark *)0x0);
  return handle;
}

Assistant:

struct fy_atom *fy_fill_atom(struct fy_parser *fyp, int advance, struct fy_atom *handle) {
    /* start mark */
    fy_fill_atom_start(fyp, handle);

    /* advance the given number of characters */
    if (advance > 0)
        fy_advance_by(fyp, advance);

    fy_fill_atom_end(fyp, handle);

    return handle;
}